

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppUTestNamerTests.cpp
# Opt level: O2

Utest * __thiscall
TEST_NamerTestGroup_TestProperNameCaseOnWindows_TestShell::createTest
          (TEST_NamerTestGroup_TestProperNameCaseOnWindows_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/tests/CppUTest_Tests/namers/CppUTestNamerTests.cpp"
                                  ,0x2d);
  TEST_NamerTestGroup_TestProperNameCaseOnWindows_Test::
  TEST_NamerTestGroup_TestProperNameCaseOnWindows_Test
            ((TEST_NamerTestGroup_TestProperNameCaseOnWindows_Test *)this_00);
  return this_00;
}

Assistant:

TEST(NamerTestGroup, TestProperNameCaseOnWindows)
{
    if (SystemUtils::isWindowsOs())
    {
        ApprovalTestNamer namer;
        auto test = ApprovalTestNamer::currentTest();
        test.setFileName(StringUtils::toLower(test.getFileName()));
        ApprovalTestNamer::currentTest(&test);
        STRCMP_EQUAL(namer.getFileName().c_str(), "CppUTestNamerTests");
    }
}